

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator::ImmutableMapFieldLiteGenerator
          (ImmutableMapFieldLiteGenerator *this,FieldDescriptor *descriptor,int messageBitIndex,
          Context *context)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char cVar5;
  undefined8 uVar6;
  pointer pcVar7;
  undefined8 uVar8;
  bool bVar9;
  JavaType JVar10;
  ClassNameResolver *pCVar11;
  FieldGeneratorInfo *info;
  FieldDescriptor *pFVar12;
  Descriptor *pDVar13;
  mapped_type *pmVar14;
  LogMessage *pLVar15;
  FieldDescriptor *pFVar16;
  undefined8 *puVar17;
  undefined8 *puVar18;
  char *pcVar19;
  code *pcVar20;
  code *pcVar21;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  ClassNameResolver *in_R8;
  code *pcVar22;
  bool bVar23;
  size_type __dnew;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_type __dnew_1;
  size_type __dnew_3;
  key_type local_100;
  undefined1 local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0 [2];
  FieldDescriptor *local_a8;
  key_type local_a0;
  key_type local_80;
  JavaType local_60;
  JavaType local_5c;
  ImmutableMapFieldLiteGenerator *local_58;
  key_type local_50;
  
  (this->super_ImmutableFieldLiteGenerator)._vptr_ImmutableFieldLiteGenerator =
       (_func_int **)&PTR__ImmutableMapFieldLiteGenerator_004d2738;
  this->descriptor_ = descriptor;
  variables = &this->variables_;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->context_ = context;
  local_58 = this;
  pCVar11 = Context::GetNameResolver(context);
  local_58->name_resolver_ = pCVar11;
  info = Context::GetFieldGeneratorInfo(context,descriptor);
  SetCommonFieldVariables(descriptor,info,variables);
  pFVar12 = (FieldDescriptor *)Context::GetNameResolver(context);
  pDVar13 = FieldDescriptor::message_type(descriptor);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_e0,(ClassNameResolver *)pFVar12,pDVar13,true);
  local_100.field_2._M_allocated_capacity._0_4_ = 0x65707974;
  local_100._M_string_length = 4;
  local_100.field_2._M_local_buf[4] = '\0';
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_100);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  pcVar22 = (code *)(local_e0 + 0x10);
  if ((code *)local_e0._0_8_ != pcVar22) {
    operator_delete((void *)local_e0._0_8_);
  }
  if (*(once_flag **)(descriptor + 0x18) != (once_flag *)0x0) {
    local_e0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_100._M_dataplus._M_p = (pointer)descriptor;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(descriptor + 0x18),(_func_void_FieldDescriptor_ptr **)local_e0,
               (FieldDescriptor **)&local_100);
  }
  if (descriptor[2] != (FieldDescriptor)0xb) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_e0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_map_field_lite.cc"
               ,0x31);
    pLVar15 = internal::LogMessage::operator<<
                        ((LogMessage *)local_e0,
                         "CHECK failed: (FieldDescriptor::TYPE_MESSAGE) == (descriptor->type()): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_100,pLVar15);
    internal::LogMessage::~LogMessage((LogMessage *)local_e0);
  }
  pDVar13 = FieldDescriptor::message_type(descriptor);
  if (*(char *)(*(long *)(pDVar13 + 0x20) + 0x4b) == '\0') {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_e0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_map_field_lite.cc"
               ,0x33);
    pLVar15 = internal::LogMessage::operator<<
                        ((LogMessage *)local_e0,"CHECK failed: message->options().map_entry(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_100,pLVar15);
    internal::LogMessage::~LogMessage((LogMessage *)local_e0);
  }
  local_d0[0]._M_allocated_capacity._0_4_ = 0x79656b;
  local_e0._8_8_ = (char *)0x3;
  local_e0._0_8_ = pcVar22;
  pFVar16 = Descriptor::FindFieldByName(pDVar13,(ConstStringParam)local_e0);
  if ((code *)local_e0._0_8_ != pcVar22) {
    operator_delete((void *)local_e0._0_8_);
  }
  local_a8 = anon_unknown_1::ValueField(descriptor);
  local_5c = GetJavaType(pFVar16);
  local_60 = GetJavaType(local_a8);
  (anonymous_namespace)::TypeName_abi_cxx11_
            ((string *)local_e0,(_anonymous_namespace_ *)pFVar16,pFVar12,(ClassNameResolver *)0x0,
             SUB81(in_R8,0));
  local_100.field_2._M_allocated_capacity._0_4_ = 0x5f79656b;
  local_100.field_2._M_local_buf[4] = 't';
  local_100.field_2._M_local_buf[5] = 'y';
  local_100.field_2._M_local_buf[6] = 'p';
  local_100.field_2._M_local_buf[7] = 'e';
  local_100._M_string_length = 8;
  local_100.field_2._M_local_buf[8] = '\0';
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_100);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((code *)local_e0._0_8_ != pcVar22) {
    operator_delete((void *)local_e0._0_8_);
  }
  pCVar11 = (ClassNameResolver *)0x1;
  (anonymous_namespace)::TypeName_abi_cxx11_
            ((string *)local_e0,(_anonymous_namespace_ *)pFVar16,pFVar12,(ClassNameResolver *)0x1,
             SUB81(in_R8,0));
  local_100.field_2._M_allocated_capacity._0_4_ = 0x65786f62;
  local_100.field_2._M_local_buf[4] = 'd';
  local_100.field_2._M_local_buf[5] = '_';
  local_100.field_2._M_local_buf[6] = 'k';
  local_100.field_2._M_local_buf[7] = 'e';
  local_100.field_2._M_local_buf[8] = 'y';
  local_100.field_2._M_local_buf[9] = '_';
  local_100.field_2._M_local_buf[10] = 't';
  local_100.field_2._M_local_buf[0xb] = 'y';
  local_100.field_2._M_local_buf[0xc] = 'p';
  local_100.field_2._M_local_buf[0xd] = 'e';
  local_100._M_string_length = 0xe;
  local_100.field_2._M_local_buf[0xe] = '\0';
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_100);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((code *)local_e0._0_8_ != pcVar22) {
    operator_delete((void *)local_e0._0_8_);
  }
  (anonymous_namespace)::KotlinTypeName_abi_cxx11_
            ((string *)local_e0,(_anonymous_namespace_ *)pFVar16,pFVar12,pCVar11);
  local_100.field_2._M_allocated_capacity._0_4_ = 0x6b5f746b;
  local_100.field_2._M_local_buf[4] = 'e';
  local_100.field_2._M_local_buf[5] = 'y';
  local_100.field_2._M_local_buf[6] = '_';
  local_100.field_2._M_local_buf[7] = 't';
  local_100.field_2._M_local_buf[8] = 'y';
  local_100.field_2._M_local_buf[9] = 'p';
  local_100.field_2._M_local_buf[10] = 'e';
  local_100._M_string_length = 0xb;
  local_100.field_2._M_local_buf[0xb] = '\0';
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_100);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((code *)local_e0._0_8_ != pcVar22) {
    operator_delete((void *)local_e0._0_8_);
  }
  (anonymous_namespace)::KotlinTypeName_abi_cxx11_
            ((string *)local_e0,(_anonymous_namespace_ *)local_a8,pFVar12,pCVar11);
  local_100.field_2._M_allocated_capacity._0_4_ = 0x765f746b;
  local_100.field_2._M_local_buf[4] = 'a';
  local_100.field_2._M_local_buf[5] = 'l';
  local_100.field_2._M_local_buf[6] = 'u';
  local_100.field_2._M_local_buf[7] = 'e';
  local_100.field_2._M_local_buf[8] = '_';
  local_100.field_2._M_local_buf[9] = 't';
  local_100.field_2._M_local_buf[10] = 'y';
  local_100.field_2._M_local_buf[0xb] = 'p';
  local_100.field_2._M_local_buf[0xc] = 'e';
  local_100._M_string_length = 0xd;
  local_100.field_2._M_local_buf[0xd] = '\0';
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_100);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_e0);
  field = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
    field = extraout_RDX_00;
  }
  if ((code *)local_e0._0_8_ != pcVar22) {
    operator_delete((void *)local_e0._0_8_);
    field = extraout_RDX_01;
  }
  (anonymous_namespace)::WireType_abi_cxx11_
            ((string *)local_e0,(_anonymous_namespace_ *)pFVar16,field);
  local_100.field_2._M_allocated_capacity._0_4_ = 0x5f79656b;
  local_100.field_2._M_local_buf[4] = 'w';
  local_100.field_2._M_local_buf[5] = 'i';
  local_100.field_2._M_local_buf[6] = 'r';
  local_100.field_2._M_local_buf[7] = 'e';
  local_100.field_2._M_local_buf[8] = '_';
  local_100.field_2._M_local_buf[9] = 't';
  local_100.field_2._M_local_buf[10] = 'y';
  local_100.field_2._M_local_buf[0xb] = 'p';
  local_100.field_2._M_local_buf[0xc] = 'e';
  local_100._M_string_length = 0xd;
  local_100.field_2._M_local_buf[0xd] = '\0';
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_100);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((code *)local_e0._0_8_ != pcVar22) {
    operator_delete((void *)local_e0._0_8_);
  }
  bVar23 = SUB81(pFVar12,0);
  DefaultValue_abi_cxx11_((string *)local_e0,(java *)pFVar16,(FieldDescriptor *)0x1,bVar23,in_R8);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"key_default_value","");
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_100);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((code *)local_e0._0_8_ != pcVar22) {
    operator_delete((void *)local_e0._0_8_);
  }
  bVar9 = IsReferenceType(local_5c);
  local_d0[0]._M_allocated_capacity._0_4_ = 0x5f79656b;
  local_d0[0]._M_allocated_capacity._4_2_ = 0x756e;
  local_d0[0]._M_local_buf[6] = 'l';
  local_d0[0]._M_local_buf[7] = 'l';
  local_d0[0]._8_2_ = 0x635f;
  local_d0[0]._M_local_buf[10] = 'h';
  local_d0[0]._M_local_buf[0xb] = 'e';
  local_d0[0]._12_2_ = 0x6b63;
  local_e0._8_8_ = (char *)0xe;
  local_d0[0]._M_local_buf[0xe] = '\0';
  local_e0._0_8_ = pcVar22;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_e0);
  pcVar19 = "java.lang.Class<?> keyClass = key.getClass();";
  if (!bVar9) {
    pcVar19 = "";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,(ulong)pcVar19);
  if ((code *)local_e0._0_8_ != pcVar22) {
    operator_delete((void *)local_e0._0_8_);
  }
  bVar9 = IsReferenceType(local_60);
  pcVar19 = "java.lang.Class<?> valueClass = value.getClass();";
  if (!bVar9) {
    pcVar19 = "";
  }
  local_e0._0_8_ = pcVar22;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"value_null_check","");
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_e0);
  pCVar11 = (ClassNameResolver *)0x31;
  if (!bVar9) {
    pCVar11 = (ClassNameResolver *)0x0;
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,(ulong)pcVar19);
  if ((code *)local_e0._0_8_ != pcVar22) {
    operator_delete((void *)local_e0._0_8_);
  }
  JVar10 = GetJavaType(local_a8);
  if (JVar10 == JAVATYPE_ENUM) {
    pcVar21 = (code *)(local_e0 + 0x10);
    local_d0[0]._M_allocated_capacity._0_4_ = 0x756c6176;
    local_d0[0]._M_allocated_capacity._4_2_ = 0x5f65;
    local_d0[0]._M_local_buf[6] = 't';
    local_d0[0]._M_local_buf[7] = 'y';
    local_d0[0]._8_2_ = 0x6570;
    local_e0._8_8_ = (char *)0xa;
    local_d0[0]._M_local_buf[10] = '\0';
    local_e0._0_8_ = pcVar21;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_e0);
    std::__cxx11::string::_M_replace((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x3e5f47);
    if ((code *)local_e0._0_8_ != pcVar21) {
      operator_delete((void *)local_e0._0_8_);
    }
    local_100._M_dataplus._M_p = (pointer)0x10;
    local_e0._0_8_ = pcVar21;
    local_e0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_e0,(ulong)&local_100);
    local_d0[0]._M_allocated_capacity._0_4_ = SUB84(local_100._M_dataplus._M_p,0);
    local_d0[0]._M_allocated_capacity._4_2_ =
         (undefined2)((ulong)local_100._M_dataplus._M_p >> 0x20);
    local_d0[0]._M_local_buf[6] = (undefined1)((ulong)local_100._M_dataplus._M_p >> 0x30);
    local_d0[0]._M_local_buf[7] = (undefined1)((ulong)local_100._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_e0._0_8_ = 0x61765f6465786f62;
    *(undefined8 *)(local_e0._0_8_ + 8) = 0x657079745f65756c;
    local_e0._8_8_ = local_100._M_dataplus._M_p;
    *(code *)(local_e0._0_8_ + (long)local_100._M_dataplus._M_p) = (code)0x0;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_e0);
    pCVar11 = (ClassNameResolver *)0x11;
    std::__cxx11::string::_M_replace((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x3ded65);
    pFVar16 = extraout_RDX_02;
    if ((code *)local_e0._0_8_ != pcVar21) {
      operator_delete((void *)local_e0._0_8_);
      pFVar16 = extraout_RDX_03;
    }
    (anonymous_namespace)::WireType_abi_cxx11_
              ((string *)local_e0,(_anonymous_namespace_ *)local_a8,pFVar16);
    local_100.field_2._M_allocated_capacity._0_4_ = 0x756c6176;
    local_100.field_2._M_local_buf[4] = 'e';
    local_100.field_2._M_local_buf[5] = '_';
    local_100.field_2._M_local_buf[6] = 'w';
    local_100.field_2._M_local_buf[7] = 'i';
    local_100.field_2._M_local_buf[8] = 'r';
    local_100.field_2._M_local_buf[9] = 'e';
    local_100.field_2._M_local_buf[10] = '_';
    local_100.field_2._M_local_buf[0xb] = 't';
    local_100.field_2._M_local_buf[0xc] = 'y';
    local_100.field_2._M_local_buf[0xd] = 'p';
    local_100.field_2._M_local_buf[0xe] = 'e';
    local_100._M_string_length = 0xf;
    local_100.field_2._M_local_buf[0xf] = '\0';
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_100);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((code *)local_e0._0_8_ != pcVar21) {
      operator_delete((void *)local_e0._0_8_);
    }
    DefaultValue_abi_cxx11_(&local_100,(java *)local_a8,(FieldDescriptor *)0x1,bVar23,pCVar11);
    puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
    pcVar20 = (code *)(puVar17 + 2);
    if ((code *)*puVar17 == pcVar20) {
      uVar6 = *(undefined8 *)pcVar20;
      uVar8 = puVar17[3];
      local_d0[0]._M_allocated_capacity._0_4_ = (undefined4)uVar6;
      local_d0[0]._M_allocated_capacity._4_2_ = (undefined2)((ulong)uVar6 >> 0x20);
      local_d0[0]._M_local_buf[6] = (undefined1)((ulong)uVar6 >> 0x30);
      local_d0[0]._M_local_buf[7] = (undefined1)((ulong)uVar6 >> 0x38);
      local_d0[0]._8_2_ = (undefined2)uVar8;
      local_d0[0]._M_local_buf[10] = (undefined1)((ulong)uVar8 >> 0x10);
      local_d0[0]._M_local_buf[0xb] = (undefined1)((ulong)uVar8 >> 0x18);
      local_d0[0]._12_2_ = (undefined2)((ulong)uVar8 >> 0x20);
      local_d0[0]._M_local_buf[0xe] = (undefined1)((ulong)uVar8 >> 0x30);
      local_d0[0]._M_local_buf[0xf] = (undefined1)((ulong)uVar8 >> 0x38);
      local_e0._0_8_ = pcVar21;
    }
    else {
      uVar6 = *(undefined8 *)pcVar20;
      local_d0[0]._M_allocated_capacity._0_4_ = (undefined4)uVar6;
      local_d0[0]._M_allocated_capacity._4_2_ = (undefined2)((ulong)uVar6 >> 0x20);
      local_d0[0]._M_local_buf[6] = (undefined1)((ulong)uVar6 >> 0x30);
      local_d0[0]._M_local_buf[7] = (undefined1)((ulong)uVar6 >> 0x38);
      local_e0._0_8_ = (code *)*puVar17;
    }
    local_e0._8_8_ = puVar17[1];
    *puVar17 = pcVar20;
    puVar17[1] = 0;
    *(undefined1 *)(puVar17 + 2) = 0;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_80._M_dataplus._M_p = (pointer)0x13;
    local_a0._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_a0,(ulong)&local_80);
    local_a0.field_2._M_allocated_capacity._0_4_ = SUB84(local_80._M_dataplus._M_p,0);
    local_a0.field_2._M_local_buf[4] = (char)((ulong)local_80._M_dataplus._M_p >> 0x20);
    local_a0.field_2._M_local_buf[5] = (char)((ulong)local_80._M_dataplus._M_p >> 0x28);
    local_a0.field_2._M_allocated_capacity._6_2_ =
         (undefined2)((ulong)local_80._M_dataplus._M_p >> 0x30);
    builtin_strncpy(local_a0._M_dataplus._M_p,"value_default_value",0x13);
    local_a0._M_string_length = (size_type)local_80._M_dataplus._M_p;
    local_a0._M_dataplus._M_p[(long)local_80._M_dataplus._M_p] = '\0';
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_a0);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((code *)local_e0._0_8_ != pcVar21) {
      operator_delete((void *)local_e0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    (anonymous_namespace)::TypeName_abi_cxx11_
              ((string *)local_e0,(_anonymous_namespace_ *)local_a8,pFVar12,(ClassNameResolver *)0x0
               ,SUB81(pCVar11,0));
    local_100.field_2._M_allocated_capacity._0_4_ = 0x756c6176;
    local_100.field_2._M_local_buf[4] = 'e';
    local_100.field_2._M_local_buf[5] = '_';
    local_100.field_2._M_local_buf[6] = 'e';
    local_100.field_2._M_local_buf[7] = 'n';
    local_100.field_2._M_local_buf[8] = 'u';
    local_100.field_2._M_local_buf[9] = 'm';
    local_100.field_2._M_local_buf[10] = '_';
    local_100.field_2._M_local_buf[0xb] = 't';
    local_100.field_2._M_local_buf[0xc] = 'y';
    local_100.field_2._M_local_buf[0xd] = 'p';
    local_100.field_2._M_local_buf[0xe] = 'e';
    local_100._M_string_length = 0xf;
    local_100.field_2._M_local_buf[0xf] = '\0';
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_100);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
      operator_delete((void *)local_e0._0_8_);
    }
    if (*(char *)(*(long *)(descriptor + 0x10) + 0x3a) == '\x03') {
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      local_100.field_2._M_allocated_capacity._0_4_ = 0x756c6176;
      local_100.field_2._M_local_buf[4] = 'e';
      local_100.field_2._M_local_buf[5] = '_';
      local_100.field_2._M_local_buf[6] = 'e';
      local_100.field_2._M_local_buf[7] = 'n';
      local_100.field_2._M_local_buf[8] = 'u';
      local_100.field_2._M_local_buf[9] = 'm';
      local_100.field_2._M_local_buf[10] = '_';
      local_100.field_2._M_local_buf[0xb] = 't';
      local_100.field_2._M_local_buf[0xc] = 'y';
      local_100.field_2._M_local_buf[0xd] = 'p';
      local_100.field_2._M_local_buf[0xe] = 'e';
      local_100._M_string_length = 0xf;
      local_100.field_2._M_local_buf[0xf] = '\0';
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,&local_100);
      pcVar7 = (pmVar14->_M_dataplus)._M_p;
      local_e0._0_8_ = local_e0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e0,pcVar7,pcVar7 + pmVar14->_M_string_length);
      std::__cxx11::string::append(local_e0);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      local_80._M_dataplus._M_p = (pointer)0x12;
      local_a0._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_a0,(ulong)&local_80);
      local_a0.field_2._M_allocated_capacity._0_4_ = SUB84(local_80._M_dataplus._M_p,0);
      local_a0.field_2._M_local_buf[4] = (char)((ulong)local_80._M_dataplus._M_p >> 0x20);
      local_a0.field_2._M_local_buf[5] = (char)((ulong)local_80._M_dataplus._M_p >> 0x28);
      local_a0.field_2._M_allocated_capacity._6_2_ =
           (undefined2)((ulong)local_80._M_dataplus._M_p >> 0x30);
      builtin_strncpy(local_a0._M_dataplus._M_p,"unrecognized_value",0x12);
      local_a0._M_string_length = (size_type)local_80._M_dataplus._M_p;
      local_a0._M_dataplus._M_p[(long)local_80._M_dataplus._M_p] = '\0';
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,&local_a0);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
        operator_delete((void *)local_e0._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      goto LAB_002f2cc3;
    }
    DefaultValue_abi_cxx11_
              ((string *)local_e0,(java *)local_a8,(FieldDescriptor *)0x1,bVar23,pCVar11);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"unrecognized_value","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_100);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    bVar23 = (undefined1 *)local_e0._0_8_ == local_e0 + 0x10;
  }
  else {
    (anonymous_namespace)::TypeName_abi_cxx11_
              ((string *)local_e0,(_anonymous_namespace_ *)local_a8,pFVar12,(ClassNameResolver *)0x0
               ,SUB81(pCVar11,0));
    local_100.field_2._M_allocated_capacity._0_4_ = 0x756c6176;
    local_100.field_2._M_local_buf[4] = 'e';
    local_100.field_2._M_local_buf[5] = '_';
    local_100.field_2._M_local_buf[6] = 't';
    local_100.field_2._M_local_buf[7] = 'y';
    local_100.field_2._M_local_buf[8] = 'p';
    local_100.field_2._M_local_buf[9] = 'e';
    local_100._M_string_length = 10;
    local_100.field_2._M_local_buf[10] = '\0';
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_100);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((code *)local_e0._0_8_ != pcVar22) {
      operator_delete((void *)local_e0._0_8_);
    }
    (anonymous_namespace)::TypeName_abi_cxx11_
              ((string *)local_e0,(_anonymous_namespace_ *)local_a8,pFVar12,(ClassNameResolver *)0x1
               ,SUB81(pCVar11,0));
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"boxed_value_type","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_100);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_e0);
    pFVar12 = extraout_RDX_04;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
      pFVar12 = extraout_RDX_05;
    }
    if ((code *)local_e0._0_8_ != pcVar22) {
      operator_delete((void *)local_e0._0_8_);
      pFVar12 = extraout_RDX_06;
    }
    (anonymous_namespace)::WireType_abi_cxx11_
              ((string *)local_e0,(_anonymous_namespace_ *)local_a8,pFVar12);
    local_100.field_2._M_allocated_capacity._0_4_ = 0x756c6176;
    local_100.field_2._M_local_buf[4] = 'e';
    local_100.field_2._M_local_buf[5] = '_';
    local_100.field_2._M_local_buf[6] = 'w';
    local_100.field_2._M_local_buf[7] = 'i';
    local_100.field_2._M_local_buf[8] = 'r';
    local_100.field_2._M_local_buf[9] = 'e';
    local_100.field_2._M_local_buf[10] = '_';
    local_100.field_2._M_local_buf[0xb] = 't';
    local_100.field_2._M_local_buf[0xc] = 'y';
    local_100.field_2._M_local_buf[0xd] = 'p';
    local_100.field_2._M_local_buf[0xe] = 'e';
    local_100._M_string_length = 0xf;
    local_100.field_2._M_local_buf[0xf] = '\0';
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_100);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((code *)local_e0._0_8_ != pcVar22) {
      operator_delete((void *)local_e0._0_8_);
    }
    DefaultValue_abi_cxx11_
              ((string *)local_e0,(java *)local_a8,(FieldDescriptor *)0x1,bVar23,pCVar11);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"value_default_value","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_100);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    bVar23 = (code *)local_e0._0_8_ == pcVar22;
  }
  if (!bVar23) {
    operator_delete((void *)local_e0._0_8_);
  }
LAB_002f2cc3:
  paVar2 = &local_a0.field_2;
  local_a0.field_2._M_allocated_capacity._0_4_ = 0x65786f62;
  local_a0.field_2._M_local_buf[4] = 'd';
  local_a0.field_2._M_local_buf[5] = '_';
  local_a0.field_2._M_allocated_capacity._6_2_ = 0x656b;
  local_a0.field_2._8_6_ = 0x657079745f79;
  local_a0._M_string_length = 0xe;
  local_a0.field_2._M_local_buf[0xe] = '\0';
  local_a0._M_dataplus._M_p = (pointer)paVar2;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_a0);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  pcVar7 = (pmVar14->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,pcVar7,pcVar7 + pmVar14->_M_string_length);
  std::__cxx11::string::append((char *)&local_100);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_50._M_dataplus._M_p = (pointer)0x10;
  local_80._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_50);
  local_80.field_2._M_allocated_capacity._0_6_ = SUB86(local_50._M_dataplus._M_p,0);
  local_80.field_2._M_allocated_capacity._6_2_ =
       (undefined2)((ulong)local_50._M_dataplus._M_p >> 0x30);
  builtin_strncpy(local_80._M_dataplus._M_p,"boxed_value_type",0x10);
  local_80._M_string_length = (size_type)local_50._M_dataplus._M_p;
  local_80._M_dataplus._M_p[(long)local_50._M_dataplus._M_p] = '\0';
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_80);
  puVar17 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_100,(ulong)(pmVar14->_M_dataplus)._M_p);
  pcVar21 = (code *)(puVar17 + 2);
  if ((code *)*puVar17 == pcVar21) {
    uVar6 = *(undefined8 *)pcVar21;
    uVar8 = puVar17[3];
    local_d0[0]._M_allocated_capacity._0_4_ = (undefined4)uVar6;
    local_d0[0]._M_allocated_capacity._4_2_ = (undefined2)((ulong)uVar6 >> 0x20);
    local_d0[0]._M_local_buf[6] = (undefined1)((ulong)uVar6 >> 0x30);
    local_d0[0]._M_local_buf[7] = (undefined1)((ulong)uVar6 >> 0x38);
    local_d0[0]._8_2_ = (undefined2)uVar8;
    local_d0[0]._M_local_buf[10] = (undefined1)((ulong)uVar8 >> 0x10);
    local_d0[0]._M_local_buf[0xb] = (undefined1)((ulong)uVar8 >> 0x18);
    local_d0[0]._12_2_ = (undefined2)((ulong)uVar8 >> 0x20);
    local_d0[0]._M_local_buf[0xe] = (undefined1)((ulong)uVar8 >> 0x30);
    local_d0[0]._M_local_buf[0xf] = (undefined1)((ulong)uVar8 >> 0x38);
    local_e0._0_8_ = pcVar22;
  }
  else {
    uVar6 = *(undefined8 *)pcVar21;
    local_d0[0]._M_allocated_capacity._0_4_ = (undefined4)uVar6;
    local_d0[0]._M_allocated_capacity._4_2_ = (undefined2)((ulong)uVar6 >> 0x20);
    local_d0[0]._M_local_buf[6] = (undefined1)((ulong)uVar6 >> 0x30);
    local_d0[0]._M_local_buf[7] = (undefined1)((ulong)uVar6 >> 0x38);
    local_e0._0_8_ = (code *)*puVar17;
  }
  local_e0._8_8_ = puVar17[1];
  *puVar17 = pcVar21;
  puVar17[1] = 0;
  *(undefined1 *)(puVar17 + 2) = 0;
  paVar3 = &local_50.field_2;
  local_50.field_2._M_allocated_capacity._0_5_ = 0x5f65707974;
  local_50.field_2._M_allocated_capacity._5_2_ = 0x6170;
  local_50.field_2._M_local_buf[7] = 'r';
  local_50.field_2._8_5_ = 0x6574656d61;
  local_50.field_2._M_local_buf[0xd] = 'r';
  local_50.field_2._M_local_buf[0xe] = 's';
  local_50._M_string_length = 0xf;
  local_50.field_2._M_local_buf[0xf] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar3;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_50);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar3) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((code *)local_e0._0_8_ != pcVar22) {
    operator_delete((void *)local_e0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  cVar5 = *(char *)(*(long *)(descriptor + 0x38) + 0x4e);
  local_d0[0]._M_allocated_capacity._0_4_ = 0x72706564;
  local_d0[0]._M_allocated_capacity._4_2_ = 0x6365;
  local_d0[0]._M_local_buf[6] = 'a';
  local_d0[0]._M_local_buf[7] = 't';
  local_d0[0]._8_2_ = 0x6f69;
  local_d0[0]._M_local_buf[10] = 'n';
  local_e0._8_8_ = (char *)0xb;
  local_d0[0]._M_local_buf[0xb] = '\0';
  local_e0._0_8_ = pcVar22;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_e0);
  pcVar19 = "";
  if (cVar5 != '\0') {
    pcVar19 = "@java.lang.Deprecated ";
  }
  std::__cxx11::string::_M_replace
            ((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,(ulong)pcVar19);
  if ((code *)local_e0._0_8_ != pcVar22) {
    operator_delete((void *)local_e0._0_8_);
  }
  cVar5 = *(char *)(*(long *)(descriptor + 0x38) + 0x4e);
  if (cVar5 == '\x01') {
    local_a0.field_2._M_allocated_capacity._0_4_ = 0x656d616e;
    local_a0._M_string_length = 4;
    local_a0.field_2._M_local_buf[4] = '\0';
    local_a0._M_dataplus._M_p = (pointer)paVar2;
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_a0);
    std::operator+(&local_100,"@kotlin.Deprecated(message = \"Field ",pmVar14);
    puVar18 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
    local_e0._0_8_ = local_e0 + 0x10;
    pcVar22 = (code *)(puVar18 + 2);
    if ((code *)*puVar18 == pcVar22) {
      uVar6 = *(undefined8 *)pcVar22;
      uVar8 = puVar18[3];
      local_d0[0]._M_allocated_capacity._0_4_ = (undefined4)uVar6;
      local_d0[0]._M_allocated_capacity._4_2_ = (undefined2)((ulong)uVar6 >> 0x20);
      local_d0[0]._M_local_buf[6] = (undefined1)((ulong)uVar6 >> 0x30);
      local_d0[0]._M_local_buf[7] = (undefined1)((ulong)uVar6 >> 0x38);
      local_d0[0]._8_2_ = (undefined2)uVar8;
      local_d0[0]._M_local_buf[10] = (undefined1)((ulong)uVar8 >> 0x10);
      local_d0[0]._M_local_buf[0xb] = (undefined1)((ulong)uVar8 >> 0x18);
      local_d0[0]._12_2_ = (undefined2)((ulong)uVar8 >> 0x20);
      local_d0[0]._M_local_buf[0xe] = (undefined1)((ulong)uVar8 >> 0x30);
      local_d0[0]._M_local_buf[0xf] = (undefined1)((ulong)uVar8 >> 0x38);
    }
    else {
      uVar6 = *(undefined8 *)pcVar22;
      local_d0[0]._M_allocated_capacity._0_4_ = (undefined4)uVar6;
      local_d0[0]._M_allocated_capacity._4_2_ = (undefined2)((ulong)uVar6 >> 0x20);
      local_d0[0]._M_local_buf[6] = (undefined1)((ulong)uVar6 >> 0x30);
      local_d0[0]._M_local_buf[7] = (undefined1)((ulong)uVar6 >> 0x38);
      local_e0._0_8_ = (code *)*puVar18;
    }
    puVar17 = puVar18 + 1;
    local_e0._8_8_ = puVar18[1];
    *puVar18 = pcVar22;
  }
  else {
    puVar17 = (undefined8 *)(local_e0 + 8);
    local_e0._0_8_ = pcVar22;
  }
  *puVar17 = 0;
  *pcVar22 = (code)0x0;
  paVar4 = &local_80.field_2;
  local_80.field_2._M_allocated_capacity._0_6_ = 0x7065645f746b;
  local_80.field_2._M_allocated_capacity._6_2_ = 0x6572;
  local_80.field_2._8_6_ = 0x6e6f69746163;
  local_80._M_string_length = 0xe;
  local_80.field_2._M_local_buf[0xe] = '\0';
  local_80._M_dataplus._M_p = (pointer)paVar4;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_80);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar4) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  pcVar22 = (code *)(local_e0 + 0x10);
  if ((code *)local_e0._0_8_ != pcVar22) {
    operator_delete((void *)local_e0._0_8_);
  }
  if (cVar5 != '\0') {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
  }
  local_50._M_dataplus._M_p = (pointer)0x10;
  local_80._M_dataplus._M_p = (pointer)paVar4;
  local_80._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_50);
  local_80.field_2._M_allocated_capacity._0_6_ = SUB86(local_50._M_dataplus._M_p,0);
  local_80.field_2._M_allocated_capacity._6_2_ =
       (undefined2)((ulong)local_50._M_dataplus._M_p >> 0x30);
  builtin_strncpy(local_80._M_dataplus._M_p,"capitalized_name",0x10);
  local_80._M_string_length = (size_type)local_50._M_dataplus._M_p;
  local_80._M_dataplus._M_p[(long)local_50._M_dataplus._M_p] = '\0';
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_80);
  pcVar7 = (pmVar14->_M_dataplus)._M_p;
  local_e0._0_8_ = pcVar22;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e0,pcVar7,pcVar7 + pmVar14->_M_string_length);
  std::__cxx11::string::append(local_e0);
  local_50.field_2._M_allocated_capacity._0_5_ = 0x7561666564;
  local_50.field_2._M_allocated_capacity._5_2_ = 0x746c;
  local_50.field_2._M_local_buf[7] = '_';
  local_50.field_2._8_5_ = 0x7972746e65;
  local_50._M_string_length = 0xd;
  local_50.field_2._M_local_buf[0xd] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar3;
  pmVar14 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,&local_50);
  std::__cxx11::string::operator=((string *)pmVar14,(string *)local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar3) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((code *)local_e0._0_8_ != pcVar22) {
    operator_delete((void *)local_e0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar4) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return;
}

Assistant:

ImmutableMapFieldLiteGenerator::ImmutableMapFieldLiteGenerator(
    const FieldDescriptor* descriptor, int messageBitIndex, Context* context)
    : descriptor_(descriptor),
      context_(context),
      name_resolver_(context->GetNameResolver()) {
  SetMessageVariables(descriptor, messageBitIndex, 0,
                      context->GetFieldGeneratorInfo(descriptor), context,
                      &variables_);
}